

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall glslang::TType::adoptImplicitArraySizes(TType *this,bool skipNonvariablyIndexed)

{
  TType *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  do {
    iVar3 = (*this->_vptr_TType[0x1f])(this);
    if ((char)iVar3 != '\0') {
      if ((*(uint *)&(this->qualifier).field_0x8 & 0xff80) == 0x2380) {
LAB_00306575:
        iVar3 = (*this->_vptr_TType[0x12])(this);
        changeOuterArraySize(this,iVar3);
        (*this->_vptr_TType[0x24])(this);
      }
      else if ((skipNonvariablyIndexed & 1U) == 0) {
        iVar3 = (*this->_vptr_TType[0x21])(this);
        if ((char)iVar3 == '\0') goto LAB_00306575;
      }
    }
    if ((((this->qualifier).field_0xd & 4) != 0) && (this->arraySizes != (TArraySizes *)0x0)) {
      bVar2 = TArraySizes::isInnerUnsized(this->arraySizes);
      if (bVar2) {
        TArraySizes::clearInnerUnsized(this->arraySizes);
      }
    }
    iVar3 = (*this->_vptr_TType[0x25])(this);
    if (((char)iVar3 == '\0') ||
       (uVar6 = (long)(((this->field_13).referentType)->qualifier).semanticName -
                *(long *)&((this->field_13).referentType)->field_0x8, uVar6 == 0)) {
      return;
    }
    uVar5 = (int)(uVar6 >> 5) - 1;
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    for (lVar4 = 0; uVar6 * 0x20 != lVar4; lVar4 = lVar4 + 0x20) {
      adoptImplicitArraySizes
                (*(TType **)
                  ((long)&((((this->field_13).structure)->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start)->type + lVar4),false);
    }
    pTVar1 = (((this->field_13).structure)->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start[(int)uVar5].type;
    iVar3 = (*this->_vptr_TType[10])(this);
    skipNonvariablyIndexed = (*(uint *)(CONCAT44(extraout_var,iVar3) + 8) & 0x7f) == 6;
    this = pTVar1;
  } while( true );
}

Assistant:

void adoptImplicitArraySizes(bool skipNonvariablyIndexed)
    {
        if (isUnsizedArray() &&
            (qualifier.builtIn == EbvSampleMask ||
                !(skipNonvariablyIndexed || isArrayVariablyIndexed()))) {
            changeOuterArraySize(getImplicitArraySize());
            setImplicitlySized(true);
        }
        // For multi-dim per-view arrays, set unsized inner dimension size to 1
        if (qualifier.isPerView() && arraySizes && arraySizes->isInnerUnsized())
            arraySizes->clearInnerUnsized();
        if (isStruct() && structure->size() > 0) {
            int lastMember = (int)structure->size() - 1;
            for (int i = 0; i < lastMember; ++i)
                (*structure)[i].type->adoptImplicitArraySizes(false);
            // implement the "last member of an SSBO" policy
            (*structure)[lastMember].type->adoptImplicitArraySizes(getQualifier().storage == EvqBuffer);
        }
    }